

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Clear(Extension *this)

{
  CppType CVar1;
  undefined8 *in_RDI;
  
  if ((*(byte *)((long)in_RDI + 9) & 1) == 0) {
    if ((*(byte *)((long)in_RDI + 10) & 1) == 0) {
      CVar1 = anon_unknown_19::cpp_type('\0');
      if (CVar1 == CPPTYPE_STRING) {
        std::__cxx11::string::clear();
      }
      else if (CVar1 == CPPTYPE_MESSAGE) {
        if ((*(byte *)((long)in_RDI + 10) >> 4 & 1) == 0) {
          (**(code **)(*(long *)*in_RDI + 0x38))();
        }
        else {
          (**(code **)(*(long *)*in_RDI + 0x70))();
        }
      }
      *(byte *)((long)in_RDI + 10) = *(byte *)((long)in_RDI + 10) & 0xf0 | 1;
    }
  }
  else {
    CVar1 = anon_unknown_19::cpp_type('\0');
    switch(CVar1) {
    case CPPTYPE_INT32:
      RepeatedField<int>::Clear((RepeatedField<int> *)*in_RDI);
      break;
    case CPPTYPE_INT64:
      RepeatedField<long>::Clear((RepeatedField<long> *)*in_RDI);
      break;
    case CPPTYPE_UINT32:
      RepeatedField<unsigned_int>::Clear((RepeatedField<unsigned_int> *)*in_RDI);
      break;
    case CPPTYPE_UINT64:
      RepeatedField<unsigned_long>::Clear((RepeatedField<unsigned_long> *)*in_RDI);
      break;
    case CPPTYPE_DOUBLE:
      RepeatedField<double>::Clear((RepeatedField<double> *)*in_RDI);
      break;
    case CPPTYPE_FLOAT:
      RepeatedField<float>::Clear((RepeatedField<float> *)*in_RDI);
      break;
    case CPPTYPE_BOOL:
      RepeatedField<bool>::Clear((RepeatedField<bool> *)*in_RDI);
      break;
    case CPPTYPE_ENUM:
      RepeatedField<int>::Clear((RepeatedField<int> *)*in_RDI);
      break;
    case CPPTYPE_STRING:
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Clear((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x48858a);
      break;
    case CPPTYPE_MESSAGE:
      RepeatedPtrField<google::protobuf::MessageLite>::Clear
                ((RepeatedPtrField<google::protobuf::MessageLite> *)0x488599);
    }
  }
  return;
}

Assistant:

void ExtensionSet::Extension::Clear() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)   \
  case WireFormatLite::CPPTYPE_##UPPERCASE: \
    repeated_##LOWERCASE##_value->Clear();  \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    if (!is_cleared) {
      switch (cpp_type(type)) {
        case WireFormatLite::CPPTYPE_STRING:
          string_value->clear();
          break;
        case WireFormatLite::CPPTYPE_MESSAGE:
          if (is_lazy) {
            lazymessage_value->Clear();
          } else {
            message_value->Clear();
          }
          break;
        default:
          // No need to do anything.  Get*() will return the default value
          // as long as is_cleared is true and Set*() will overwrite the
          // previous value.
          break;
      }

      is_cleared = true;
    }
  }
}